

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O1

void arm_v7m_cpu_do_interrupt_aarch64(CPUState *cs)

{
  int *piVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  TranslationBlock *pTVar5;
  byte bVar6;
  _Bool _Var7;
  _Bool _Var8;
  ARMMMUIdx AVar9;
  uint32_t uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  tcg_target_ulong tVar14;
  tcg_target_ulong tVar15;
  byte bVar16;
  uint uVar17;
  uint *puVar18;
  uint uVar19;
  uint32_t addr;
  uint addr_00;
  uint uVar20;
  TranslationBlock **ppTVar21;
  CPUARMState_conflict *pCVar22;
  bool bVar23;
  bool bVar24;
  uint16_t local_66;
  uint local_64;
  CPUARMState_conflict *local_60;
  uint local_54;
  TranslationBlock **local_50;
  ulong local_48;
  undefined8 local_40;
  ulong local_38;
  
  iVar3 = cs->exception_index;
  if (0x15 < iVar3 - 1U) {
switchD_006292ad_caseD_6:
    cpu_abort_aarch64(cs,"Unhandled exception 0x%x\n");
  }
  pCVar22 = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  switch(iVar3) {
  case 1:
    puVar18 = (uint *)((long)cs[1].tb_jmp_cache +
                      (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar18 = *puVar18 | 0x10000;
    break;
  case 2:
  case 5:
  case 7:
  case 0x14:
    break;
  case 3:
  case 4:
    uVar17 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c) & 0xf;
    if (uVar17 == 8) {
      if (iVar3 == 4) {
        pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2b9d);
        *pbVar2 = *pbVar2 | 0x82;
        *(undefined4 *)(cs[1].tb_jmp_cache + 0x577) = *(undefined4 *)(cs[1].tb_jmp_cache + 0x586);
      }
      else if (iVar3 == 3) {
        pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2b9d);
        *pbVar2 = *pbVar2 | 1;
      }
    }
    else if (uVar17 == 0xe) {
      if (iVar3 == 4) {
        pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
        *pbVar2 = *pbVar2 | 8;
      }
      else if (iVar3 == 3) {
        uVar17 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac);
        if (*(int *)(cs[1].tb_jmp_cache + 0x57c) == 0) {
          uVar17 = uVar17 | 1;
        }
        else {
          uVar17 = uVar17 | 0x10;
        }
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) = uVar17;
      }
    }
    else if (uVar17 == 0xf) {
      if (*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0) {
        __assert_fail("!env->v7m.secure",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                      ,0x77e,"_Bool v7m_handle_execute_nsc(ARMCPU *)");
      }
      if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) == 0) {
        __assert_fail("arm_feature(env, ARM_FEATURE_M_SECURITY)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                      ,0x77f,"_Bool v7m_handle_execute_nsc(ARMCPU *)");
      }
      AVar9 = arm_v7m_mmu_idx_for_secstate_aarch64(pCVar22,true);
      _Var8 = v7m_read_half_insn((ARMCPU_conflict1 *)cs,AVar9,
                                 *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2094),&local_66);
      if (_Var8) {
        if ((*(int *)(cs[1].tb_jmp_cache + 0x44f) != 0) && (local_66 == 0xe97f)) {
          _Var8 = v7m_read_half_insn((ARMCPU_conflict1 *)cs,AVar9,
                                     *(int *)((long)cs[1].tb_jmp_cache + 0x2094) + 2,&local_66);
          if (!_Var8) break;
          if (local_66 == 0xe97f) {
            *(byte *)(cs[1].tb_jmp_cache + 0x412) = *(byte *)(cs[1].tb_jmp_cache + 0x412) & 0xfe;
            *(byte *)(cs[1].tb_jmp_cache + 0x572) = *(byte *)(cs[1].tb_jmp_cache + 0x572) & 0xf7;
            switch_v7m_security_state(pCVar22,true);
            *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x227c) = 0;
            piVar1 = (int *)((long)cs[1].tb_jmp_cache + 0x2094);
            *piVar1 = *piVar1 + 4;
            arm_rebuild_hflags_aarch64(pCVar22);
            return;
          }
        }
        pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
        *pbVar2 = *pbVar2 | 1;
      }
    }
    else if (iVar3 == 4) {
      puVar18 = (uint *)((long)cs[1].tb_jmp_cache +
                        (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
      *puVar18 = *puVar18 | 0x82;
      *(undefined4 *)
       ((long)cs[1].tb_jmp_cache + (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2bb0) =
           *(undefined4 *)(cs[1].tb_jmp_cache + 0x586);
    }
    else if (iVar3 == 3) {
      puVar18 = (uint *)((long)cs[1].tb_jmp_cache +
                        (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
      *puVar18 = *puVar18 | 1;
    }
    break;
  default:
    goto switchD_006292ad_caseD_6;
  case 8:
    uVar17 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2094);
    if (0xfeffffff < uVar17) {
      return;
    }
    if (uVar17 < 0xfefffffe) {
      __assert_fail("env->regs[15] >= FNC_RETURN_MIN_MAGIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                    ,0x856,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
    }
    if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) == 0) {
      __assert_fail("arm_feature(env, ARM_FEATURE_M_SECURITY)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                    ,0x857,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
    }
    bVar6 = (*(byte *)(cs[1].tb_jmp_cache + 0x572) & 2) >> 1 &
            *(int *)(cs[1].tb_jmp_cache + 0x579) == 0;
    if (*(int *)(cs[1].tb_jmp_cache + 0x57c) == 1) {
      if (*(int *)(cs[1].tb_jmp_cache + 0x579) == 0) {
        bVar16 = (*(byte *)(cs[1].tb_jmp_cache + 0x572) & 2) >> 1;
      }
      else {
        bVar16 = 0;
      }
      ppTVar21 = (TranslationBlock **)((long)cs[1].tb_jmp_cache + 0x208c);
      if (bVar6 != bVar16) {
        ppTVar21 = cs[1].tb_jmp_cache + 0x56e;
      }
    }
    else if (bVar6 == 0) {
      ppTVar21 = (TranslationBlock **)((long)cs[1].tb_jmp_cache + 0x2b74);
    }
    else {
      ppTVar21 = cs[1].tb_jmp_cache + 0x56f;
    }
    uVar17 = *(uint *)ppTVar21;
    AVar9 = arm_v7m_mmu_idx_for_secstate_aarch64(pCVar22,true);
    tVar14 = helper_le_ldul_mmu_aarch64(pCVar22,(ulong)uVar17,AVar9 & 7,0);
    local_60 = pCVar22;
    tVar15 = helper_le_ldul_mmu_aarch64(pCVar22,(ulong)(uVar17 + 4),AVar9 & 7,0);
    pCVar22 = local_60;
    if ((*(int *)(cs[1].tb_jmp_cache + 0x579) == 0 && (tVar15 & 0x1ff) == 0) ||
       ((*(int *)(cs[1].tb_jmp_cache + 0x579) == 1 && ((tVar15 & 0x1ff) != 0)))) {
      *(uint *)ppTVar21 = uVar17 + 8;
      switch_v7m_security_state(local_60,true);
      *(uint *)(cs[1].tb_jmp_cache + 0x579) = (uint)tVar15 & 0x1ff;
      *(uint *)(cs[1].tb_jmp_cache + 0x572) =
           (uint)tVar15 >> 0x11 & 8 | *(uint *)(cs[1].tb_jmp_cache + 0x572) & 0xfffffff7;
      *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x227c) = 0;
      *(uint *)(cs[1].tb_jmp_cache + 0x44f) = (uint)tVar14 & 1;
      *(uint *)((long)cs[1].tb_jmp_cache + 0x2094) = (uint)tVar14 & 0xfffffffe;
      arm_rebuild_hflags_aarch64(pCVar22);
      return;
    }
    puVar18 = (uint *)((long)cs[1].tb_jmp_cache +
                      (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar18 = *puVar18 | 0x40000;
    break;
  case 0x10:
    *(uint *)((long)cs[1].tb_jmp_cache + 0x2094) =
         *(int *)((long)cs[1].tb_jmp_cache + 0x2094) +
         (uint)(*(int *)(cs[1].tb_jmp_cache + 0x44f) == 0) * 2 + 2;
    return;
  case 0x11:
    lVar11 = 1;
    if (*(int *)(cs[1].tb_jmp_cache + 0x587) != 3) {
      lVar11 = (long)*(int *)(cs[1].tb_jmp_cache + 0x57c);
    }
    pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + lVar11 * 4 + 0x2b9e);
    *pbVar2 = *pbVar2 | 8;
    break;
  case 0x12:
    puVar18 = (uint *)((long)cs[1].tb_jmp_cache +
                      (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar18 = *puVar18 | 0x20000;
    break;
  case 0x13:
    puVar18 = (uint *)((long)cs[1].tb_jmp_cache +
                      (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar18 = *puVar18 | 0x100000;
    break;
  case 0x15:
    pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
    *pbVar2 = *pbVar2 | 0x80;
    break;
  case 0x16:
    puVar18 = (uint *)((long)cs[1].tb_jmp_cache +
                      (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar18 = *puVar18 | 0x1000000;
  }
  uVar17 = *(uint *)((long)cs[1].tb_jmp_cache + 0x208c);
  uVar13 = (ulong)uVar17;
  uVar20 = *(uint *)((long)cs[1].tb_jmp_cache + 0x227c);
  uVar19 = *(int *)((long)cs[1].tb_jmp_cache + 0x2274) << 0x10 |
           (uVar20 & 0xfc) << 8 |
           (uVar20 & 3) << 0x19 |
           *(int *)(cs[1].tb_jmp_cache + 0x44f) << 0x18 |
           *(int *)(cs[1].tb_jmp_cache + 0x44e) << 0x1b |
           *(uint *)((long)cs[1].tb_jmp_cache + 0x2264) >> 3 & 0x10000000 |
           *(int *)(cs[1].tb_jmp_cache + 0x44c) << 0x1d |
           (uint)(*(int *)((long)cs[1].tb_jmp_cache + 0x226c) == 0) << 0x1e |
           *(uint *)(cs[1].tb_jmp_cache + 0x44d) & 0x80000000 |
           *(uint *)(cs[1].tb_jmp_cache + 0x579);
  AVar9 = arm_mmu_idx_aarch64(pCVar22);
  uVar20 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2c24);
  local_40 = 0xffffffe0;
  local_64 = 0x10;
  if (((*(uint *)(cs[1].tb_jmp_cache + 0x572) & 4) != 0) &&
     ((uVar20 & 0x400) != 0 || *(int *)(cs[1].tb_jmp_cache + 0x57c) != 0)) {
    if ((*(int *)(cs[1].tb_jmp_cache + 0x57c) == 0) ||
       ((*(byte *)((long)cs[1].tb_jmp_cache + 0x2c13) & 4) == 0)) {
      local_40 = 0xffffff98;
    }
    else {
      local_40 = 0xffffff58;
      local_64 = 0x20;
    }
  }
  if (((uVar17 & 4) != 0) &&
     ((*(byte *)((long)cs[1].tb_jmp_cache +
                (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b95) & 2) != 0)) {
    uVar13 = (ulong)(uVar17 - 4);
    uVar19 = uVar19 | 0x200;
  }
  uVar12 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
  bVar24 = false;
  uVar17 = (*(uint *)(cs[1].tb_jmp_cache + 0x572) & 8) << 0x11;
  if (uVar12 == 0) {
    uVar17 = 0;
  }
  addr_00 = (int)uVar13 + (int)local_40;
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508b) & 8) == 0) {
    bVar23 = true;
  }
  else {
    if ((*(int *)(cs[1].tb_jmp_cache + 0x579) == 0) &&
       ((*(byte *)((long)cs[1].tb_jmp_cache + uVar12 * 4 + 0x2b8c) & 2) != 0)) {
      puVar18 = (uint *)((long)cs[1].tb_jmp_cache + uVar12 * 4 + 0x2bfc);
    }
    else {
      puVar18 = (uint *)((long)cs[1].tb_jmp_cache + uVar12 * 4 + 0x2bf4);
    }
    uVar4 = *puVar18;
    bVar23 = uVar4 <= addr_00;
    if (!bVar23) {
      pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + uVar12 * 4 + 0x2b9e);
      *pbVar2 = *pbVar2 | 0x10;
      *(uint *)((long)cs[1].tb_jmp_cache + 0x208c) = uVar4;
    }
    bVar24 = addr_00 < uVar4;
  }
  local_60 = pCVar22;
  local_38 = uVar13;
  if (bVar23) {
    _Var8 = false;
    _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00,*(uint32_t *)(cs[1].tb_jmp_cache + 0x40b)
                            ,AVar9,STACK_NORMAL);
    if (_Var7) {
      _Var8 = false;
      _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 4,
                              *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x205c),AVar9,STACK_NORMAL);
      if (_Var7) {
        _Var8 = false;
        _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 8,
                                *(uint32_t *)(cs[1].tb_jmp_cache + 0x40c),AVar9,STACK_NORMAL);
        if (_Var7) {
          _Var8 = false;
          _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0xc,
                                  *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2064),AVar9,
                                  STACK_NORMAL);
          if (_Var7) {
            _Var8 = false;
            _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x10,
                                    *(uint32_t *)(cs[1].tb_jmp_cache + 0x411),AVar9,STACK_NORMAL);
            if (_Var7) {
              _Var8 = false;
              _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x14,
                                      *(uint32_t *)(cs[1].tb_jmp_cache + 0x412),AVar9,STACK_NORMAL);
              if (_Var7) {
                _Var8 = false;
                _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x18,
                                        *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2094),AVar9,
                                        STACK_NORMAL);
                if (_Var7) {
                  _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x1c,
                                          uVar17 | uVar19 & 0xffefffff,AVar9,STACK_NORMAL);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    _Var8 = false;
  }
  if (((ulong)cs[1].tb_jmp_cache[0x572] & 4) == 0) goto LAB_00629c49;
  if (((*(byte *)((long)cs[1].tb_jmp_cache +
                 (ulong)(*(uint *)(cs[1].tb_jmp_cache + 0x582) & 4) + 0x2c0c) & 1) != 0) &&
     ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) != 0)) {
    pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
    *pbVar2 = *pbVar2 | 0x80;
    goto LAB_00629c49;
  }
  uVar13 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
  if ((uVar20 & 0x400) == 0 && *(uint *)(cs[1].tb_jmp_cache + 0x57c) == 0) {
    pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + 0x2ba2);
    *pbVar2 = *pbVar2 | 8;
    goto LAB_00629c49;
  }
  if ((*(uint *)(cs[1].tb_jmp_cache + 0x582) >> 0x1e & 1) != 0) goto LAB_00629c49;
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x5089) & 2) == 0) {
    if (*(int *)((long)cs[1].tb_jmp_cache + 0x21a4) == 0) {
      uVar17 = *(uint *)((long)cs[1].tb_jmp_cache + 0x21ac) & 0x1f;
      if (uVar17 == 0x10) {
        uVar17 = 0;
LAB_00629828:
        local_54 = 0;
        switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar13 != 0) * 4 + 0x2c1c) >> 0x14 & 3)
        {
        case 1:
switchD_006297e8_caseD_1:
          local_54 = (uint)(uVar17 != 0);
          break;
        case 3:
switchD_006297e8_caseD_3:
          local_54 = 1;
        }
      }
      else if (uVar17 == 0x16) {
        uVar17 = 1;
        local_54 = 0;
        switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar13 != 0) * 4 + 0x2c1c) >> 0x14 & 3)
        {
        case 1:
          goto switchD_006297e8_caseD_1;
        case 3:
          goto switchD_006297e8_caseD_3;
        }
      }
      else {
        if (uVar17 != 0x1a) {
          uVar17 = 1;
          goto LAB_00629828;
        }
        uVar17 = 1;
        local_54 = 0;
        switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar13 != 0) * 4 + 0x2c1c) >> 0x14 & 3)
        {
        case 1:
          goto switchD_006297e8_caseD_1;
        case 3:
          goto switchD_006297e8_caseD_3;
        }
      }
    }
    else {
      uVar17 = *(uint *)(cs[1].tb_jmp_cache + 0x434) >> 2 & 3;
      local_54 = 0;
      switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar13 != 0) * 4 + 0x2c1c) >> 0x14 & 3) {
      case 1:
        goto switchD_006297e8_caseD_1;
      case 3:
        goto switchD_006297e8_caseD_3;
      }
    }
  }
  else {
    uVar17 = 1;
    if (*(int *)(cs[1].tb_jmp_cache + 0x579) != 0) goto LAB_00629828;
    uVar17 = ~*(uint *)((long)cs[1].tb_jmp_cache + uVar13 * 4 + 0x2b8c) & 1;
    local_54 = 0;
    switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar13 != 0) * 4 + 0x2c1c) >> 0x14 & 3) {
    case 1:
      goto switchD_006297e8_caseD_1;
    case 3:
      goto switchD_006297e8_caseD_3;
    }
  }
  if ((_Var8 != false) && ((char)local_54 == '\0')) {
    pbVar2 = (byte *)((long)cs[1].tb_jmp_cache + uVar13 * 4 + 0x2b9e);
    *pbVar2 = *pbVar2 | 8;
    _Var8 = false;
  }
  local_50 = cs[1].tb_jmp_cache + 0x58d;
  uVar19 = 0;
  uVar20 = 0;
  uVar17 = local_64;
  uVar10 = (int)local_40 + (int)local_38 + 0x20;
  local_48 = (ulong)addr_00;
  do {
    addr = uVar10;
    if (0xf < uVar20) {
      addr = uVar10 + 8;
    }
    if (_Var8 == false) {
      _Var8 = false;
    }
    else {
      pTVar5 = local_50[(ulong)(uVar20 >> 2) * 0x20 + (ulong)(uVar19 & 1)];
      _Var7 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr,(uint32_t)pTVar5,AVar9,STACK_NORMAL);
      _Var8 = false;
      uVar17 = local_64;
      if (_Var7) {
        _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr + 4,(uint32_t)((ulong)pTVar5 >> 0x20),
                                AVar9,STACK_NORMAL);
        uVar17 = local_64;
      }
    }
    pCVar22 = local_60;
    uVar20 = uVar20 + 2;
    uVar19 = uVar19 + 1;
    uVar10 = uVar10 + 8;
  } while (uVar20 < uVar17);
  addr_00 = (uint)local_48;
  if (_Var8 != false) {
    uVar10 = vfp_get_fpscr_aarch64(local_60);
    v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x60,uVar10,AVar9,STACK_NORMAL);
  }
  if ((char)local_54 != '\0') {
    uVar17 = 0;
    uVar20 = 0;
    do {
      local_50[(ulong)(uVar20 >> 2) * 0x20 + (ulong)(uVar17 & 1)] = (TranslationBlock *)0x0;
      uVar20 = uVar20 + 2;
      uVar17 = uVar17 + 1;
    } while (uVar20 < local_64);
    vfp_set_fpscr_aarch64(pCVar22,0);
  }
LAB_00629c49:
  if (!bVar24) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x208c) = addr_00;
  }
  return;
}

Assistant:

void arm_v7m_cpu_do_interrupt(CPUState *cs)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    uint32_t lr;
    bool ignore_stackfaults;

    // arm_log_exception(cs->exception_index);

    /*
     * For exceptions we just mark as pending on the NVIC, and let that
     * handle it.
     */
    switch (cs->exception_index) {
    case EXCP_UDEF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNDEFINSTR_MASK;
        break;
    case EXCP_NOCP:
    {
        /*
         * NOCP might be directed to something other than the current
         * security state if this fault is because of NSACR; we indicate
         * the target security state using exception.target_el.
         */
        int target_secstate;

        if (env->exception.target_el == 3) {
            target_secstate = M_REG_S;
        } else {
            target_secstate = env->v7m.secure;
        }
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, target_secstate);
        env->v7m.cfsr[target_secstate] |= R_V7M_CFSR_NOCP_MASK;
        break;
    }
    case EXCP_INVSTATE:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_INVSTATE_MASK;
        break;
    case EXCP_STKOF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_STKOF_MASK;
        break;
    case EXCP_LSERR:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
        env->v7m.sfsr |= R_V7M_SFSR_LSERR_MASK;
        break;
    case EXCP_UNALIGNED:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNALIGNED_MASK;
        break;
    case EXCP_SWI:
        /* The PC already points to the next instruction.  */
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SVC, env->v7m.secure);
        break;
    case EXCP_PREFETCH_ABORT:
    case EXCP_DATA_ABORT:
        /*
         * Note that for M profile we don't have a guest facing FSR, but
         * the env->exception.fsr will be populated by the code that
         * raises the fault, in the A profile short-descriptor format.
         */
        switch (env->exception.fsr & 0xf) {
        case M_FAKE_FSR_NSC_EXEC:
            /*
             * Exception generated when we try to execute code at an address
             * which is marked as Secure & Non-Secure Callable and the CPU
             * is in the Non-Secure state. The only instruction which can
             * be executed like this is SG (and that only if both halves of
             * the SG instruction have the same security attributes.)
             * Everything else must generate an INVEP SecureFault, so we
             * emulate the SG instruction here.
             */
            if (v7m_handle_execute_nsc(cpu)) {
                return;
            }
            break;
        case M_FAKE_FSR_SFAULT:
            /*
             * Various flavours of SecureFault for attempts to execute or
             * access data in the wrong security state.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                if (env->v7m.secure) {
                    env->v7m.sfsr |= R_V7M_SFSR_INVTRAN_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVTRAN\n");
                } else {
                    env->v7m.sfsr |= R_V7M_SFSR_INVEP_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVEP\n");
                }
                break;
            case EXCP_DATA_ABORT:
                /* This must be an NS access to S memory */
                env->v7m.sfsr |= R_V7M_SFSR_AUVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT,
                              "...really SecureFault with SFSR.AUVIOL\n");
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
            break;
        case 0x8: /* External Abort */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[M_REG_NS] |= R_V7M_CFSR_IBUSERR_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IBUSERR\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[M_REG_NS] |=
                    (R_V7M_CFSR_PRECISERR_MASK | R_V7M_CFSR_BFARVALID_MASK);
                env->v7m.bfar = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.PRECISERR and BFAR 0x%x\n",
                              env->v7m.bfar);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_BUS, false);
            break;
        default:
            /*
             * All other FSR values are either MPU faults or "can't happen
             * for M profile" cases.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_IACCVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IACCVIOL\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[env->v7m.secure] |=
                    (R_V7M_CFSR_DACCVIOL_MASK | R_V7M_CFSR_MMARVALID_MASK);
                env->v7m.mmfar[env->v7m.secure] = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.DACCVIOL and MMFAR 0x%x\n",
                              env->v7m.mmfar[env->v7m.secure]);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_MEM,
                                    env->v7m.secure);
            break;
        }
        break;
    case EXCP_SEMIHOST:
        qemu_log_mask(CPU_LOG_INT,
                      "...handling as semihosting call 0x%x\n",
                      env->regs[0]);
        // env->regs[0] = do_arm_semihosting(env); FIXME
        env->regs[15] += env->thumb ? 2 : 4;
        return;
    case EXCP_BKPT:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_DEBUG, false);
        break;
    case EXCP_IRQ:
        break;
    case EXCP_EXCEPTION_EXIT:
        if (env->regs[15] < EXC_RETURN_MIN_MAGIC) {
            /* Must be v8M security extension function return */
            assert(env->regs[15] >= FNC_RETURN_MIN_MAGIC);
            assert(arm_feature(env, ARM_FEATURE_M_SECURITY));
            if (do_v7m_function_return(cpu)) {
                return;
            }
        } else {
            do_v7m_exception_exit(cpu);
            return;
        }
        break;
    case EXCP_LAZYFP:
        /*
         * We already pended the specific exception in the NVIC in the
         * v7m_preserve_fp_state() helper function.
         */
        break;
    default:
        cpu_abort(cs, "Unhandled exception 0x%x\n", cs->exception_index);
        return; /* Never happens.  Keep compiler happy.  */
    }

    if (arm_feature(env, ARM_FEATURE_V8)) {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_DCRS_MASK;
        /*
         * The S bit indicates whether we should return to Secure
         * or NonSecure (ie our current state).
         * The ES bit indicates whether we're taking this exception
         * to Secure or NonSecure (ie our target state). We set it
         * later, in v7m_exception_taken().
         * The SPSEL bit is also set in v7m_exception_taken() for v8M.
         * This corresponds to the ARM ARM pseudocode for v8M setting
         * some LR bits in PushStack() and some in ExceptionTaken();
         * the distinction matters for the tailchain cases where we
         * can take an exception without pushing the stack.
         */
        if (env->v7m.secure) {
            lr |= R_V7M_EXCRET_S_MASK;
        }
    } else {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_S_MASK |
            R_V7M_EXCRET_DCRS_MASK |
            R_V7M_EXCRET_ES_MASK;
        if (env->v7m.control[M_REG_NS] & R_V7M_CONTROL_SPSEL_MASK) {
            lr |= R_V7M_EXCRET_SPSEL_MASK;
        }
    }
    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_FPCA_MASK)) {
        lr |= R_V7M_EXCRET_FTYPE_MASK;
    }
    if (!arm_v7m_is_handler_mode(env)) {
        lr |= R_V7M_EXCRET_MODE_MASK;
    }

    ignore_stackfaults = v7m_push_stack(cpu);
    v7m_exception_taken(cpu, lr, false, ignore_stackfaults);
}